

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall
CFGTest_ReachingDefinitionsIf_Test::TestBody(CFGTest_ReachingDefinitionsIf_Test *this)

{
  size_t *this_00;
  __node_base_ptr *this_01;
  pointer *this_02;
  __node_base_ptr __s;
  bool bVar1;
  Function *func_00;
  reference ppLVar2;
  reference ppLVar3;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar4;
  char *message;
  Name NVar5;
  AssertHelper local_6c8;
  Message local_6c0;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_6a0 [8];
  GetSetsMap expectedResult;
  LocalSet *setA2;
  LocalSet *setB;
  LocalSet *setA1;
  LocalGet *getA2;
  LocalGet *getB;
  LocalGet *getA1;
  FindAll<wasm::LocalGet> foundGets;
  FindAll<wasm::LocalSet> foundSets;
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  analyzer;
  ReachingDefinitionsTransferFunction transferFunction;
  Locations locations;
  GetSetsMap getSetsMap;
  CFG cfg;
  Function *func;
  allocator<char> local_429;
  string local_428;
  undefined1 local_408 [8];
  Module wasm;
  char *moduleText;
  CFGTest_ReachingDefinitionsIf_Test *this_local;
  
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_6a271;
  ::wasm::Module::Module((Module *)local_408);
  __s = wasm.tagsMap._M_h._M_single_bucket;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,(char *)__s,&local_429);
  PrintTest::parseWast(&this->super_CFGTest,(Module *)local_408,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  ::wasm::Name::Name((Name *)&cfg.field_0x10,"bar");
  NVar5.super_IString.str._M_str = (char *)cfg._16_8_;
  NVar5.super_IString.str._M_len = (size_t)local_408;
  func_00 = (Function *)::wasm::Module::getFunction(NVar5);
  ::wasm::analysis::CFG::fromFunction((Function *)&getSetsMap._M_h._M_single_bucket);
  this_00 = &locations._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
  ::unordered_map((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                   *)this_00);
  this_01 = &transferFunction.lattice.memberIndices._M_h._M_single_bucket;
  std::
  map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  ::map((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
         *)this_01);
  ::wasm::analysis::ReachingDefinitionsTransferFunction::ReachingDefinitionsTransferFunction
            ((ReachingDefinitionsTransferFunction *)
             &analyzer.states.
              super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,func_00,(GetSetsMap *)this_00,
             (Locations *)this_01);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::MonotoneCFGAnalyzer
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&foundSets.list.
                 super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
             (FinitePowersetLattice<wasm::LocalSet_*> *)
             &transferFunction.fakeSetPtrs._M_h._M_single_bucket,
             (ReachingDefinitionsTransferFunction *)
             &analyzer.states.
              super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (CFG *)&getSetsMap._M_h._M_single_bucket);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::evaluateFunctionEntry
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&foundSets.list.
                 super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,func_00);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::evaluateAndCollectResults
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&foundSets.list.
                 super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  ::wasm::FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)
             &foundGets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,func_00->body);
  ::wasm::FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&getA1,func_00->body);
  ppLVar2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::operator[]
                      ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&getA1,0);
  getB = *ppLVar2;
  ppLVar2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::operator[]
                      ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&getA1,1);
  getA2 = *ppLVar2;
  ppLVar2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::operator[]
                      ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&getA1,2);
  setA1 = (LocalSet *)*ppLVar2;
  this_02 = &foundGets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppLVar3 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::operator[]
                      ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)this_02,0);
  setB = *ppLVar3;
  ppLVar3 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::operator[]
                      ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)this_02,1);
  setA2 = *ppLVar3;
  ppLVar3 = std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::operator[]
                      ((vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *)this_02,2);
  expectedResult._M_h._M_single_bucket = (__node_base_ptr)*ppLVar3;
  std::
  unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
  ::unordered_map((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                   *)local_6a0);
  pSVar4 = &std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                          *)local_6a0,&getB)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar4,&setB);
  pSVar4 = &std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                          *)local_6a0,&getA2)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar4,(LocalSet **)&gtest_ar.message_);
  pSVar4 = &std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                          *)local_6a0,&getA2)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar4,&setA2);
  pSVar4 = &std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                          *)local_6a0,(key_type *)&setA1)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar4,&setB);
  pSVar4 = &std::
            unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
            ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                          *)local_6a0,(key_type *)&setA1)->
            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ;
  ::wasm::
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  ::insert(pSVar4,(LocalSet **)&expectedResult._M_h._M_single_bucket);
  testing::internal::EqHelper::
  Compare<std::unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>,_std::unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>,_nullptr>
            ((EqHelper *)local_6b8,"expectedResult","getSetsMap",
             (unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)local_6a0,
             (unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)&locations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/cfg.cpp"
               ,400,message);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  std::
  unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
  ::~unordered_map((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                    *)local_6a0);
  ::wasm::FindAll<wasm::LocalGet>::~FindAll((FindAll<wasm::LocalGet> *)&getA1);
  ::wasm::FindAll<wasm::LocalSet>::~FindAll
            ((FindAll<wasm::LocalSet> *)
             &foundGets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::analysis::
  MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
  ::~MonotoneCFGAnalyzer
            ((MonotoneCFGAnalyzer<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
              *)&foundSets.list.
                 super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  ::wasm::analysis::ReachingDefinitionsTransferFunction::~ReachingDefinitionsTransferFunction
            ((ReachingDefinitionsTransferFunction *)
             &analyzer.states.
              super__Vector_base<wasm::analysis::FiniteIntPowersetLattice::Element,_std::allocator<wasm::analysis::FiniteIntPowersetLattice::Element>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  ::~map((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
          *)&transferFunction.lattice.memberIndices._M_h._M_single_bucket);
  std::
  unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
  ::~unordered_map((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                    *)&locations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::wasm::analysis::CFG::~CFG((CFG *)&getSetsMap._M_h._M_single_bucket);
  ::wasm::Module::~Module((Module *)local_408);
  return;
}

Assistant:

TEST_F(CFGTest, ReachingDefinitionsIf) {
  auto moduleText = R"wasm(
    (module
      (func $bar
        (local $a i32)
        (local $b i32)
        (local.set $a
          (i32.const 1)
        )
        (if
          (i32.eq
            (local.get $a)
            (i32.const 2)
          )
          (then
            (local.set $b
              (i32.const 3)
            )
          )
          (else
            (local.set $a
              (i32.const 4)
            )
          )
        )
        (drop
          (local.get $b)
        )
        (drop
          (local.get $a)
        )
      )
    )
  )wasm";

  Module wasm;
  parseWast(wasm, moduleText);

  Function* func = wasm.getFunction("bar");
  CFG cfg = CFG::fromFunction(func);

  LocalGraph::GetSetsMap getSetsMap;
  LocalGraph::Locations locations;
  ReachingDefinitionsTransferFunction transferFunction(
    func, getSetsMap, locations);

  MonotoneCFGAnalyzer<FinitePowersetLattice<LocalSet*>,
                      ReachingDefinitionsTransferFunction>
    analyzer(transferFunction.lattice, transferFunction, cfg);
  analyzer.evaluateFunctionEntry(func);
  analyzer.evaluateAndCollectResults();

  FindAll<LocalSet> foundSets(func->body);
  FindAll<LocalGet> foundGets(func->body);

  LocalGet* getA1 = foundGets.list[0];
  LocalGet* getB = foundGets.list[1];
  LocalGet* getA2 = foundGets.list[2];
  LocalSet* setA1 = foundSets.list[0];
  LocalSet* setB = foundSets.list[1];
  LocalSet* setA2 = foundSets.list[2];

  LocalGraph::GetSetsMap expectedResult;
  expectedResult[getA1].insert(setA1);
  expectedResult[getB].insert(nullptr);
  expectedResult[getB].insert(setB);
  expectedResult[getA2].insert(setA1);
  expectedResult[getA2].insert(setA2);

  EXPECT_EQ(expectedResult, getSetsMap);
}